

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus ZydisNodeHandlerEMVEX(ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZydisInstructionEncoding ZVar1;
  ZyanU16 *index_local;
  ZydisDecodedInstruction *instruction_local;
  
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xdff,
                  "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if (index == (ZyanU16 *)0x0) {
    __assert_fail("index",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xe00,
                  "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  ZVar1 = instruction->encoding;
  if (ZVar1 == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
    *index = 0;
  }
  else if (ZVar1 == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
    if ((instruction->attributes & 0x20) == 0) {
      __assert_fail("instruction->attributes & (1ULL << 5)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xe08,
                    "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
    }
    *index = (ushort)(instruction->raw).field_3.rex.offset +
             (ushort)(instruction->raw).field_3.xop.pp * 8 + 1;
  }
  else {
    if (ZVar1 != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xe10,
                    "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
    }
    if ((instruction->attributes & 0x40) == 0) {
      __assert_fail("instruction->attributes & (1ULL << 6)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xe0c,
                    "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
    }
    *index = (ushort)(instruction->raw).field_3.rex.offset +
             (ushort)(instruction->raw).field_3.xop.pp * 4 + 0x21;
  }
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    switch (instruction->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        *index = 0;
        break;
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_EVEX);
        *index = instruction->raw.evex.mmm + (instruction->raw.evex.pp << 3) + 1;
        break;
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_MVEX);
        *index = instruction->raw.mvex.mmmm + (instruction->raw.mvex.pp << 2) + 33;
        break;
    default:
        ZYAN_UNREACHABLE;
    }
    return ZYAN_STATUS_SUCCESS;
}